

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mov_pc_npc(DisasContext_conflict8 *dc)

{
  TCGContext_conflict8 *tcg_ctx;
  target_ulong tVar1;
  
  tVar1 = dc->npc;
  tcg_ctx = dc->uc->tcg_ctx;
  if (tVar1 != 1) {
    if (tVar1 != 2) goto LAB_0090dc22;
    gen_generic_branch(dc);
  }
  tcg_gen_mov_i64_sparc64(tcg_ctx,(TCGv_i32)tcg_ctx->cpu_pc,(TCGv_i32)tcg_ctx->cpu_npc);
  tVar1 = 1;
LAB_0090dc22:
  dc->pc = tVar1;
  return;
}

Assistant:

static inline void gen_mov_pc_npc(DisasContext *dc)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    if (dc->npc == JUMP_PC) {
        gen_generic_branch(dc);
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_pc, tcg_ctx->cpu_npc);
        dc->pc = DYNAMIC_PC;
    } else if (dc->npc == DYNAMIC_PC) {
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_pc, tcg_ctx->cpu_npc);
        dc->pc = DYNAMIC_PC;
    } else {
        dc->pc = dc->npc;
    }
}